

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O1

BOOL reduce_switch(List *list,SymbolTable *sym,int macro_level)

{
  TokenType TVar1;
  ListStruct *pLVar2;
  List *ls;
  BOOL extraout_EAX;
  ListStruct *pLVar3;
  ListStruct *extraout_RAX;
  ListStruct *pLVar4;
  ListStruct *new;
  
  pLVar2 = list->car;
  pLVar3 = pLVar2->cdr;
  if ((pLVar3->token).type == TOK_NUMBER) {
    pLVar4 = pLVar3->cdr;
    if (pLVar4 == (ListStruct *)0x0) {
      new = (List *)0x0;
    }
    else {
      new = (ListStruct *)0x0;
      do {
        ls = pLVar4->car;
        TVar1 = (ls->token).type;
        pLVar3 = (ListStruct *)(ulong)TVar1;
        if (TVar1 == TOK_NUMBER) {
          pLVar3 = (ListStruct *)(ls->token).u.n;
          if (pLVar3 == (ListStruct *)(pLVar2->cdr->token).u.string) {
            new = ls->cdr;
            break;
          }
        }
        else if (TVar1 == TOK_DEFAULT) {
          new = ls->cdr;
        }
        else {
          parse_error(ls,"Expecting a number for switch case value.\n");
          pLVar3 = extraout_RAX;
        }
        pLVar4 = pLVar4->cdr;
      } while (pLVar4 != (ListStruct *)0x0);
    }
    if (new != (List *)0x0) {
      replace_list(list,new);
      return extraout_EAX;
    }
    (list->token).type = TOK_EMPTY;
  }
  return (BOOL)pLVar3;
}

Assistant:

static BOOL
reduce_switch (List *list, const SymbolTable *sym, int macro_level)
{
  List *ls = list->car, *tmp;
  List *match = NULL;

  /* We can only reduce switches on compile-time constants. */
  if (ls->cdr->token.type != TOK_NUMBER)
    return FALSE;

  /* Loop over all of the switch clauses and find the first one that
   * matches.
   */
  for (tmp = CDDR (ls); tmp != NULL; tmp = tmp->cdr)
    {
      if (tmp->car->token.type == TOK_DEFAULT)
	match = CDAR (tmp);   /* Make this the default. */
      else if (tmp->car->token.type != TOK_NUMBER)
	parse_error (tmp->car, "Expecting a number for switch case value.\n");
      else if (tmp->car->token.u.n == ls->cdr->token.u.n)
	{
	  match = CDAR (tmp);
	  break;
	}
    }

  /* If the switch didn't hit ANYTHING, replace with a TOK_EMPTY. */
  if (match == NULL)
    list->token.type = TOK_EMPTY;
  else
    {
      replace_list (list, match);
      return TRUE;
    }

  return FALSE;
}